

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

void Of_ManPrintCuts(Of_Man_t *p)

{
  Gia_Man_t *p_00;
  uint uVar1;
  uint nCutsAll;
  Vec_Int_t *vFirst;
  Vec_Int_t *vCutNum;
  Vec_Int_t *vBestNode;
  Vec_Int_t *vBestCut;
  undefined4 extraout_var;
  Gia_Obj_t *pGVar2;
  uint *puVar3;
  int *piVar4;
  int v;
  long lVar5;
  uint Entry;
  uint *puVar6;
  int iVar7;
  int Entry_00;
  
  vFirst = Vec_IntStartFull(p->pGia->nObjs);
  vCutNum = Vec_IntStartFull(p->pGia->nObjs);
  vBestNode = Vec_IntAlloc(100);
  vBestCut = Vec_IntAlloc(100);
  p_00 = p->pGia;
  uVar1 = Gia_ManAndNum(p_00);
  Gia_ManFillValue(p_00);
  Entry = 0;
  nCutsAll = 0;
  for (lVar5 = 0; lVar5 < p->pGia->nObjs; lVar5 = lVar5 + 1) {
    v = (int)lVar5;
    pGVar2 = Gia_ManObj(p->pGia,v);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar2 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar2) {
      if (p->pObjs[lVar5].nRefs == 0) {
        puVar3 = (uint *)0x0;
      }
      else {
        Vec_IntPush(vBestNode,Entry);
        puVar3 = (uint *)Of_ObjCutBestP(p,v);
      }
      pGVar2->Value = Entry;
      piVar4 = Of_ObjCutSet(p,v);
      puVar6 = (uint *)(piVar4 + 1);
      iVar7 = 0;
      Entry_00 = *piVar4;
      if (*piVar4 < 1) {
        Entry_00 = 0;
      }
      Vec_IntWriteEntry(vFirst,v,nCutsAll + uVar1);
      Vec_IntWriteEntry(vCutNum,v,Entry_00);
      for (; iVar7 < *piVar4; iVar7 = iVar7 + 1) {
        if (puVar3 == puVar6) {
          Vec_IntPush(vBestCut,nCutsAll + uVar1 + iVar7);
        }
        puVar6 = puVar6 + (ulong)(*puVar6 & 0x1f) + 4;
      }
      Entry = Entry + 1;
      nCutsAll = nCutsAll + iVar7;
    }
  }
  if (Entry == uVar1) {
    printf("Total:   Ands = %d.  Luts = %d.  Cuts = %d.\n",CONCAT44(extraout_var,uVar1),
           (ulong)(uint)vBestNode->nSize,(ulong)nCutsAll);
    Of_ManCreateSat(p,nCutsAll,vFirst,vCutNum,vBestNode,vBestCut);
    Vec_IntFree(vFirst);
    Vec_IntFree(vCutNum);
    Vec_IntFree(vBestNode);
    Vec_IntFree(vBestCut);
    return;
  }
  __assert_fail("nAndsAll == Shift",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                ,0x68b,"void Of_ManPrintCuts(Of_Man_t *)");
}

Assistant:

void Of_ManPrintCuts( Of_Man_t * p )
{
    int fVerbose = 0;
    Gia_Obj_t * pObj;
    int * pCutSet, * pCut, * pCutBest;
    int i, k, v, Var, nCuts;
    Vec_Int_t * vFirst  = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vCutNum = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vBestNode = Vec_IntAlloc( 100 );
    Vec_Int_t * vBestCut  = Vec_IntAlloc( 100 );
    int nAndsAll = 0, nCutsAll = 0, Shift = Gia_ManAndNum(p->pGia);
    Gia_ManFillValue( p->pGia );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        // get the best cut
        pCutBest = NULL;
        if ( Of_ObjRefNum(p, i) )
        {
            Vec_IntPush( vBestNode, nAndsAll );
            pCutBest = Of_ObjCutBestP( p, i ); 
        }
        pObj->Value = nAndsAll++;
        // get the cutset
        pCutSet = Of_ObjCutSet(p, i);
        // count cuts
        nCuts = 0;
        Of_SetForEachCut( pCutSet, pCut, k )
            nCuts++;
        // save
        Vec_IntWriteEntry( vFirst,  i, Shift + nCutsAll );
        Vec_IntWriteEntry( vCutNum, i, nCuts );
        // print cuts
        if ( fVerbose )
            printf( "Node %d. Cuts %d.\n", i, nCuts );
        Of_SetForEachCut( pCutSet, pCut, k )
        {
            if ( fVerbose )
            {
                printf( "{ " );
                Of_CutForEachVar( pCut, Var, v )
                    printf( "%d ", Var );
                printf( "} %s\n", pCutBest == pCut ? "best" :"" );
            }
            if ( pCutBest == pCut )
                Vec_IntPush( vBestCut, Shift + nCutsAll );
            nCutsAll++;
        }
    }
    assert( nAndsAll == Shift );
    printf( "Total:   Ands = %d.  Luts = %d.  Cuts = %d.\n", nAndsAll, Vec_IntSize(vBestNode), nCutsAll );

    // create SAT problem
    Of_ManCreateSat( p, nCutsAll, vFirst, vCutNum, vBestNode, vBestCut );

    Vec_IntFree( vFirst );
    Vec_IntFree( vCutNum );
    Vec_IntFree( vBestNode );
    Vec_IntFree( vBestCut );
}